

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalTypeOptimization.cpp
# Opt level: O1

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
anon_func::FieldRemover::create(FieldRemover *this)

{
  _func_int *p_Var1;
  _func_int **pp_Var2;
  long in_RSI;
  
  p_Var1 = *(_func_int **)(in_RSI + 0x108);
  pp_Var2 = (_func_int **)operator_new(0x110);
  pp_Var2[1] = (_func_int *)0x0;
  pp_Var2[2] = (_func_int *)(pp_Var2 + 4);
  pp_Var2[3] = (_func_int *)0x0;
  *(undefined1 *)(pp_Var2 + 4) = 0;
  pp_Var2[6] = (_func_int *)0x0;
  pp_Var2[7] = (_func_int *)0x0;
  pp_Var2[0x1c] = (_func_int *)0x0;
  pp_Var2[0x1d] = (_func_int *)0x0;
  pp_Var2[0x1e] = (_func_int *)0x0;
  pp_Var2[0x1f] = (_func_int *)0x0;
  pp_Var2[0x20] = (_func_int *)0x0;
  *pp_Var2 = (_func_int *)&PTR__WalkerPass_00d88a60;
  pp_Var2[0x21] = p_Var1;
  (this->super_WalkerPass<wasm::PostWalker<FieldRemover,_wasm::Visitor<FieldRemover,_void>_>_>).
  super_Pass._vptr_Pass = pp_Var2;
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
        return std::make_unique<FieldRemover>(parent);
      }